

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionType.cpp
# Opt level: O2

int __thiscall
hdc::FunctionType::clone
          (FunctionType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer ppTVar1;
  int iVar2;
  FunctionType *this_00;
  undefined4 extraout_var;
  int i;
  ulong uVar3;
  Type *local_30;
  
  this_00 = (FunctionType *)operator_new(0x30);
  FunctionType(this_00);
  uVar3 = 0;
  while( true ) {
    ppTVar1 = (this->subtypes).super__Vector_base<hdc::Type_*,_std::allocator<hdc::Type_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->subtypes).super__Vector_base<hdc::Type_*,_std::allocator<hdc::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= uVar3)
    break;
    iVar2 = (*(ppTVar1[uVar3]->super_ASTNode)._vptr_ASTNode[3])();
    local_30 = (Type *)CONCAT44(extraout_var,iVar2);
    std::vector<hdc::Type*,std::allocator<hdc::Type*>>::emplace_back<hdc::Type*>
              ((vector<hdc::Type*,std::allocator<hdc::Type*>> *)&this_00->subtypes,&local_30);
    uVar3 = uVar3 + 1;
  }
  return (int)this_00;
}

Assistant:

Type *FunctionType::clone() {
    FunctionType* cloned = new FunctionType();

    for (int i = 0; i < subtypes.size(); ++i) {
        cloned->subtypes.push_back(subtypes[i]->clone());
    }

    return cloned;
}